

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

bool __thiscall lan::db::str_compare(db *this,char target,string *content)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (content->_M_string_length == uVar2) break;
    uVar1 = uVar2 + 1;
  } while ((content->_M_dataplus)._M_p[uVar2] != target);
  return uVar2 < content->_M_string_length;
}

Assistant:

bool db::str_compare(const char target, const std::string content){
            for(register_t i = 0 ; i < content.length() ; i++)
                if(content.data()[i] == target)
                    return true;
                return false;
        }